

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCodes.h
# Opt level: O0

void jbcoin::RPC::inject_error<Json::Value>(error_code_i code,Value *json)

{
  Value *pVVar1;
  Value local_60;
  Value local_50 [2];
  Value local_30;
  ErrorInfo *local_20;
  ErrorInfo *info;
  Value *json_local;
  error_code_i code_local;
  
  info = (ErrorInfo *)json;
  json_local._4_4_ = code;
  local_20 = get_error_info(code);
  Json::Value::Value(&local_30,&local_20->token);
  pVVar1 = Json::Value::operator[]((Value *)info,(StaticString *)&jss::error);
  Json::Value::operator=(pVVar1,&local_30);
  Json::Value::~Value(&local_30);
  Json::Value::Value(local_50,local_20->code);
  pVVar1 = Json::Value::operator[]((Value *)info,(StaticString *)&jss::error_code);
  Json::Value::operator=(pVVar1,local_50);
  Json::Value::~Value(local_50);
  Json::Value::Value(&local_60,&local_20->message);
  pVVar1 = Json::Value::operator[]((Value *)info,(StaticString *)&jss::error_message);
  Json::Value::operator=(pVVar1,&local_60);
  Json::Value::~Value(&local_60);
  return;
}

Assistant:

void inject_error (error_code_i code, JsonValue& json)
{
    ErrorInfo const& info (get_error_info (code));
    json [jss::error] = info.token;
    json [jss::error_code] = info.code;
    json [jss::error_message] = info.message;
}